

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O0

void __thiscall QSocketNotifier::QSocketNotifier(QSocketNotifier *this,Type type,QObject *parent)

{
  QSocketNotifierPrivate *pQVar1;
  Type in_ESI;
  QSocketNotifierPrivate *in_RDI;
  QObject *in_stack_00000010;
  QSocketNotifierPrivate *d;
  QObject *in_stack_00000020;
  
  operator_new(0x88);
  QSocketNotifierPrivate::QSocketNotifierPrivate(in_RDI);
  QObject::QObject(in_stack_00000020,&d->super_QObjectPrivate,in_stack_00000010);
  (in_RDI->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR_metaObject_00be7968;
  pQVar1 = d_func((QSocketNotifier *)0x427c98);
  qRegisterMetaType<QSocketDescriptor>();
  qRegisterMetaType<QSocketNotifier::Type>();
  pQVar1->sntype = in_ESI;
  return;
}

Assistant:

QSocketNotifier::QSocketNotifier(Type type, QObject *parent)
    : QObject(*new QSocketNotifierPrivate, parent)
{
    Q_D(QSocketNotifier);

    qRegisterMetaType<QSocketDescriptor>();
    qRegisterMetaType<QSocketNotifier::Type>();

    d->sntype = type;
}